

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::DiffuseAreaLight::PDF_Le
          (DiffuseAreaLight *this,Interaction *intr,Vector3f *w,Float *pdfPos,Float *pdfDir)

{
  Float FVar1;
  type tVar2;
  float fVar3;
  Normal3f va;
  Tuple3<pbrt::Normal3,_float> local_38;
  
  va.super_Tuple3<pbrt::Normal3,_float>.z = (intr->n).super_Tuple3<pbrt::Normal3,_float>.z;
  va.super_Tuple3<pbrt::Normal3,_float>.x = (intr->n).super_Tuple3<pbrt::Normal3,_float>.x;
  va.super_Tuple3<pbrt::Normal3,_float>.y = (intr->n).super_Tuple3<pbrt::Normal3,_float>.y;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  if (va.super_Tuple3<pbrt::Normal3,_float>.x == 0.0) {
    if ((((va.super_Tuple3<pbrt::Normal3,_float>.y == 0.0) &&
         (!NAN(va.super_Tuple3<pbrt::Normal3,_float>.y))) &&
        (va.super_Tuple3<pbrt::Normal3,_float>.z == 0.0)) &&
       (!NAN(va.super_Tuple3<pbrt::Normal3,_float>.z))) {
      LogFatal<char_const(&)[7],char_const(&)[18],char_const(&)[7],pbrt::Normal3<float>&,char_const(&)[18],pbrt::Normal3<float>&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
                 ,0x30a,"Check failed: %s != %s with %s = %s, %s = %s",(char (*) [7])"intr.n",
                 (char (*) [18])0x27e87de,(char (*) [7])"intr.n",&va,(char (*) [18])0x27e87de,
                 (Normal3<float> *)&local_38);
    }
  }
  FVar1 = TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
          ::Dispatch<pbrt::ShapeHandle::PDF(pbrt::Interaction_const&)const::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
                      *)&this->shape,(anon_class_8_1_3fcf65e3)intr);
  *pdfPos = FVar1;
  if (this->twoSided == true) {
    tVar2 = AbsDot<float>(&intr->n,w);
    fVar3 = tVar2 * 0.31830987 * 0.5;
  }
  else {
    tVar2 = Dot<float>(&intr->n,w);
    fVar3 = tVar2 * 0.31830987;
  }
  *pdfDir = fVar3;
  return;
}

Assistant:

void DiffuseAreaLight::PDF_Le(const Interaction &intr, Vector3f &w, Float *pdfPos,
                              Float *pdfDir) const {
    CHECK_NE(intr.n, Normal3f(0, 0, 0));
    *pdfPos = shape.PDF(intr);
    *pdfDir = twoSided ? (.5 * CosineHemispherePDF(AbsDot(intr.n, w)))
                       : CosineHemispherePDF(Dot(intr.n, w));
}